

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Model.h
# Opt level: O0

void Model<Slot>::readFromFile(string *filename)

{
  bool bVar1;
  _Ios_Openmode __a;
  long *plVar2;
  pair<int,_Slot> local_1518;
  undefined1 local_ba0 [8];
  Slot object;
  string local_220 [8];
  fstream file;
  string *filename_local;
  
  std::fstream::fstream(local_220);
  __a = std::operator|(_S_in,_S_out);
  std::operator|(__a,_S_bin);
  std::fstream::open(local_220,(_Ios_Openmode)filename);
  Slot::Slot((Slot *)local_ba0);
  while( true ) {
    plVar2 = (long *)std::istream::read((char *)local_220,(long)local_ba0);
    bVar1 = std::ios::operator_cast_to_bool((ios *)((long)plVar2 + *(long *)(*plVar2 + -0x18)));
    if (!bVar1) break;
    std::pair<int,_Slot>::pair<int_&,_Slot_&,_true>(&local_1518,(int *)&object,(Slot *)local_ba0);
    std::map<int,Slot,std::less<int>,std::allocator<std::pair<int_const,Slot>>>::
    insert<std::pair<int,Slot>>
              ((map<int,Slot,std::less<int>,std::allocator<std::pair<int_const,Slot>>> *)&objectList
               ,&local_1518);
  }
  std::fstream::close();
  std::fstream::~fstream(local_220);
  return;
}

Assistant:

void Model<T>::readFromFile(const string &filename) {
    fstream file;
    file.open(filename, ios::in | ios::out | ios::binary);
    T object;
    while (file.read((char *) &object, sizeof(object))) {
        Model<T>::objectList.insert(pair<int, T>(object.id, object));
    }
    file.close();
}